

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void CheckHash<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)4,(mp::expr::Kind)24>
               (BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
                e)

{
  int iVar1;
  char *message;
  AssertHelper local_40;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  AssertionResult gtest_ar;
  size_t local_20;
  BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
  e_local;
  
  iVar1 = *(int *)e.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.super_ExprBase.impl_;
  e_local = e;
  gtest_ar._0_8_ =
       mp::
       BasicUnaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)4,_(mp::expr::Kind)24>
       ::arg(&e_local);
  local_20 = mp::internal::HashCombine<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>
                       ((long)iVar1 + 0x9e3779b9,
                        (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)&gtest_ar);
  local_38.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>::operator()
                 ((hash<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_> *)&local_40,
                  (Expr)e_local.super_BasicExpr<(mp::expr::Kind)4,_(mp::expr::Kind)24>.
                        super_ExprBase.impl_);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"hash","ExprHash()(e)",&local_20,(unsigned_long *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x3d9
               ,message);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_38);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

void CheckHash(mp::BasicUnaryExpr<Arg, FIRST, LAST> e) {
  size_t hash = HashCombine<int>(0, e.kind());
  hash = HashCombine<Expr>(hash, e.arg());
  EXPECT_EQ(hash, ExprHash()(e));
}